

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabulatedDistributions.test.cpp
# Opt level: O1

void verifyChunk(TabulatedDistributions *chunk)

{
  pointer pTVar1;
  bool bVar2;
  long lVar3;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef macroName_53;
  StringRef macroName_54;
  StringRef macroName_55;
  StringRef macroName_56;
  StringRef macroName_57;
  StringRef macroName_58;
  StringRef macroName_59;
  StringRef macroName_60;
  StringRef macroName_61;
  StringRef macroName_62;
  StringRef macroName_63;
  StringRef macroName_64;
  StringRef macroName_65;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  StringRef capturedExpression_53;
  StringRef capturedExpression_54;
  StringRef capturedExpression_55;
  StringRef capturedExpression_56;
  StringRef capturedExpression_57;
  StringRef capturedExpression_58;
  StringRef capturedExpression_59;
  StringRef capturedExpression_60;
  StringRef capturedExpression_61;
  StringRef capturedExpression_62;
  StringRef capturedExpression_63;
  StringRef capturedExpression_64;
  StringRef capturedExpression_65;
  AssertionHandler catchAssertionHandler_24;
  AssertionHandler catchAssertionHandler;
  undefined1 local_170 [8];
  undefined8 local_168;
  char *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158 [2];
  bool local_135;
  IResultCapture *local_130;
  undefined1 local_128 [8];
  undefined8 local_120;
  ITransientExpression *local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110 [2];
  double local_f0;
  ITransientExpression local_e8;
  double *local_d8;
  WithinRelMatcher *local_d0;
  undefined1 local_c8 [48];
  undefined1 local_98 [16];
  IResultCapture *local_88;
  vector<long,_std::allocator<long>_> local_80;
  vector<double,_std::allocator<double>_> local_68;
  vector<double,_std::allocator<double>_> local_50;
  
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xac;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x13;
  capturedExpression.m_start = "false == chunk.LI()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName,(SourceLineInfo *)local_170,capturedExpression,
             ContinueOnFailure);
  local_170 = (undefined1  [8])&PTR_streamReconstructedExpression_001d61b8;
  local_168._0_3_ = 0x101;
  local_160 = "==";
  local_158[0]._M_allocated_capacity = 2;
  local_158[0]._8_8_ = local_158[0]._8_8_ & 0xffffffffffffff00;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_170);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xad;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x27;
  capturedExpression_00.m_start = "false == chunk.isotropicDistributions()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_00,(SourceLineInfo *)local_170,
             capturedExpression_00,ContinueOnFailure);
  local_170 = (undefined1  [8])&PTR_streamReconstructedExpression_001d61b8;
  local_168._0_3_ = 0x101;
  local_160 = "==";
  local_158[0]._M_allocated_capacity = 2;
  local_158[0]._8_8_ = local_158[0]._8_8_ & 0xffffffffffffff00;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_170);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xae;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x10;
  capturedExpression_01.m_start = "2 == chunk.LTT()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_01,(SourceLineInfo *)local_170,
             capturedExpression_01,ContinueOnFailure);
  local_168._0_2_ = 0x101;
  local_170 = (undefined1  [8])&PTR_streamReconstructedExpression_001d61f8;
  local_168._4_4_ = 2;
  local_160 = "==";
  local_158[0]._M_allocated_capacity = 2;
  local_158[0]._8_4_ = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_170);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xaf;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x10;
  capturedExpression_02.m_start = "2 == chunk.LAW()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_02,(SourceLineInfo *)local_170,
             capturedExpression_02,ContinueOnFailure);
  local_168._0_2_ = 0x101;
  local_170 = (undefined1  [8])&PTR_streamReconstructedExpression_001d61f8;
  local_168._4_4_ = 2;
  local_160 = "==";
  local_158[0]._M_allocated_capacity = 2;
  local_158[0]._8_4_ = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_170);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xb1;
  macroName_03.m_size = 10;
  macroName_03.m_start = "CHECK_THAT";
  capturedExpression_03.m_size = 0x1b;
  capturedExpression_03.m_start = "1., WithinRel( chunk.EG() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_03,(SourceLineInfo *)local_170,
             capturedExpression_03,ContinueOnFailure);
  local_e8._vptr_ITransientExpression = (_func_int **)0x3ff0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_170,
             (double)(long)(chunk->
                           super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                           ).
                           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                           .interpolation_.super_InterpolationBase.metadata.fields.
                           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                           super__Head_base<0UL,_double,_false>._M_head_impl);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_170,(double *)&local_e8);
  local_120._1_1_ = bVar2;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6238;
  local_118 = &local_e8;
  local_110[0]._0_8_ = (WithinRelMatcher *)local_170;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xb2;
  macroName_04.m_size = 10;
  macroName_04.m_start = "CHECK_THAT";
  capturedExpression_04.m_size = 0x25;
  capturedExpression_04.m_start = "1., WithinRel( chunk.photonEnergy() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_04,(SourceLineInfo *)local_170,
             capturedExpression_04,ContinueOnFailure);
  local_e8._vptr_ITransientExpression = (_func_int **)0x3ff0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_170,
             (double)(long)(chunk->
                           super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                           ).
                           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                           .interpolation_.super_InterpolationBase.metadata.fields.
                           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                           super__Head_base<0UL,_double,_false>._M_head_impl);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_170,(double *)&local_e8);
  local_120._1_1_ = bVar2;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6238;
  local_118 = &local_e8;
  local_110[0]._0_8_ = (WithinRelMatcher *)local_170;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xb3;
  macroName_05.m_size = 10;
  macroName_05.m_start = "CHECK_THAT";
  capturedExpression_05.m_size = 0x1b;
  capturedExpression_05.m_start = "2., WithinRel( chunk.ES() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_05,(SourceLineInfo *)local_170,
             capturedExpression_05,ContinueOnFailure);
  local_e8._vptr_ITransientExpression = (_func_int **)0x4000000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_170,
             (double)(long)(chunk->
                           super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                           ).
                           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                           .interpolation_.super_InterpolationBase.metadata.fields.
                           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                           super__Head_base<1UL,_double,_false>._M_head_impl);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_170,(double *)&local_e8);
  local_120._1_1_ = bVar2;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6238;
  local_118 = &local_e8;
  local_110[0]._0_8_ = (WithinRelMatcher *)local_170;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xb4;
  macroName_06.m_size = 10;
  macroName_06.m_start = "CHECK_THAT";
  capturedExpression_06.m_size = 0x24;
  capturedExpression_06.m_start = "2., WithinRel( chunk.levelEnergy() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_06,(SourceLineInfo *)local_170,
             capturedExpression_06,ContinueOnFailure);
  local_e8._vptr_ITransientExpression = (_func_int **)0x4000000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_170,
             (double)(long)(chunk->
                           super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                           ).
                           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                           .interpolation_.super_InterpolationBase.metadata.fields.
                           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                           super__Head_base<1UL,_double,_false>._M_head_impl);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_170,(double *)&local_e8);
  local_120._1_1_ = bVar2;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6238;
  local_118 = &local_e8;
  local_110[0]._0_8_ = (WithinRelMatcher *)local_170;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xb6;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0xf;
  capturedExpression_07.m_start = "2 == chunk.NE()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_07,(SourceLineInfo *)local_170,
             capturedExpression_07,ContinueOnFailure);
  local_158[0]._8_8_ =
       (chunk->super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
       super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>.
       interpolation_.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish[-1]
  ;
  local_168._1_1_ = local_158[0]._8_8_ == 2;
  local_168._0_1_ = true;
  local_170 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_168._4_4_ = 2;
  local_160 = "==";
  local_158[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_170);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xb7;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x23;
  capturedExpression_08.m_start = "2 == chunk.numberIncidentEnergies()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_08,(SourceLineInfo *)local_170,
             capturedExpression_08,ContinueOnFailure);
  local_158[0]._8_8_ =
       (chunk->super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
       super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>.
       interpolation_.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish[-1]
  ;
  local_168._1_1_ = local_158[0]._8_8_ == 2;
  local_168._0_1_ = true;
  local_170 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_168._4_4_ = 2;
  local_160 = "==";
  local_158[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_170);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xb8;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0xf;
  capturedExpression_09.m_start = "1 == chunk.NR()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_09,(SourceLineInfo *)local_170,
             capturedExpression_09,ContinueOnFailure);
  lVar3 = (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_158[0]._8_8_ = lVar3 >> 3;
  local_168._1_1_ = lVar3 == 8;
  local_168._0_1_ = true;
  local_170 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_168._4_4_ = 1;
  local_160 = "==";
  local_158[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_170);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xb9;
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  capturedExpression_10.m_size = 0x27;
  capturedExpression_10.m_start = "1 == chunk.numberInterpolationRegions()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_10,(SourceLineInfo *)local_170,
             capturedExpression_10,ContinueOnFailure);
  lVar3 = (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_158[0]._8_8_ = lVar3 >> 3;
  local_168._1_1_ = lVar3 == 8;
  local_168._0_1_ = true;
  local_170 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_168._4_4_ = 1;
  local_160 = "==";
  local_158[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_170);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xba;
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  capturedExpression_11.m_size = 0x17;
  capturedExpression_11.m_start = "1 == chunk.INT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_11,(SourceLineInfo *)local_170,
             capturedExpression_11,ContinueOnFailure);
  lVar3 = (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_158[0]._8_8_ = lVar3 >> 3;
  local_168._1_1_ = lVar3 == 8;
  local_168._0_1_ = true;
  local_170 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62b8;
  local_168._4_4_ = 1;
  local_160 = "==";
  local_158[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_170);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xbb;
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  capturedExpression_12.m_size = 0x17;
  capturedExpression_12.m_start = "1 == chunk.NBT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_12,(SourceLineInfo *)local_170,
             capturedExpression_12,ContinueOnFailure);
  lVar3 = (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_158[0]._8_8_ = lVar3 >> 3;
  local_168._1_1_ = lVar3 == 8;
  local_168._0_1_ = true;
  local_170 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62b8;
  local_168._4_4_ = 1;
  local_160 = "==";
  local_158[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_170);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xbc;
  macroName_13.m_size = 5;
  macroName_13.m_start = "CHECK";
  capturedExpression_13.m_size = 0x13;
  capturedExpression_13.m_start = "1 == chunk.INT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_13,(SourceLineInfo *)local_170,
             capturedExpression_13,ContinueOnFailure);
  local_158[0]._8_8_ =
       *(chunk->super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
        super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>.
        interpolation_.super_InterpolationBase.interpolationSchemeIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  local_168._1_1_ = local_158[0]._8_8_ == 1;
  local_168._0_1_ = true;
  local_170 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_168._4_4_ = 1;
  local_160 = "==";
  local_158[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_170);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xbd;
  macroName_14.m_size = 5;
  macroName_14.m_start = "CHECK";
  capturedExpression_14.m_size = 0x13;
  capturedExpression_14.m_start = "2 == chunk.NBT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_14,(SourceLineInfo *)local_170,
             capturedExpression_14,ContinueOnFailure);
  local_158[0]._8_8_ =
       *(chunk->super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
        super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>.
        interpolation_.super_InterpolationBase.boundaryIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  local_168._1_1_ = local_158[0]._8_8_ == 2;
  local_168._0_1_ = true;
  local_170 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_168._4_4_ = 2;
  local_160 = "==";
  local_158[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_170);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xbe;
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  capturedExpression_15.m_size = 0x20;
  capturedExpression_15.m_start = "1 == chunk.interpolants().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_15,(SourceLineInfo *)local_170,
             capturedExpression_15,ContinueOnFailure);
  lVar3 = (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_158[0]._8_8_ = lVar3 >> 3;
  local_168._1_1_ = lVar3 == 8;
  local_168._0_1_ = true;
  local_170 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62b8;
  local_168._4_4_ = 1;
  local_160 = "==";
  local_158[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_170);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xbf;
  macroName_16.m_size = 5;
  macroName_16.m_start = "CHECK";
  capturedExpression_16.m_size = 0x1e;
  capturedExpression_16.m_start = "1 == chunk.boundaries().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_16,(SourceLineInfo *)local_170,
             capturedExpression_16,ContinueOnFailure);
  lVar3 = (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                .interpolation_.super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_158[0]._8_8_ = lVar3 >> 3;
  local_168._1_1_ = lVar3 == 8;
  local_168._0_1_ = true;
  local_170 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62b8;
  local_168._4_4_ = 1;
  local_160 = "==";
  local_158[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_170);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xc0;
  macroName_17.m_size = 5;
  macroName_17.m_start = "CHECK";
  capturedExpression_17.m_size = 0x1c;
  capturedExpression_17.m_start = "1 == chunk.interpolants()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_17,(SourceLineInfo *)local_170,
             capturedExpression_17,ContinueOnFailure);
  local_158[0]._8_8_ =
       *(chunk->super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
        super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>.
        interpolation_.super_InterpolationBase.interpolationSchemeIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  local_168._1_1_ = local_158[0]._8_8_ == 1;
  local_168._0_1_ = true;
  local_170 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_168._4_4_ = 1;
  local_160 = "==";
  local_158[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_170);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xc1;
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  capturedExpression_18.m_size = 0x1a;
  capturedExpression_18.m_start = "2 == chunk.boundaries()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_18,(SourceLineInfo *)local_170,
             capturedExpression_18,ContinueOnFailure);
  local_158[0]._8_8_ =
       *(chunk->super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
        super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>.
        interpolation_.super_InterpolationBase.boundaryIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  local_168._1_1_ = local_158[0]._8_8_ == 2;
  local_168._0_1_ = true;
  local_170 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_168._4_4_ = 2;
  local_160 = "==";
  local_158[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_170);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xc3;
  macroName_19.m_size = 5;
  macroName_19.m_start = "CHECK";
  capturedExpression_19.m_size = 0x24;
  capturedExpression_19.m_start = "2 == chunk.incidentEnergies().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_19,(SourceLineInfo *)local_170,
             capturedExpression_19,ContinueOnFailure);
  lVar3 = (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                .sequence_.
                super__Vector_base<njoy::ENDFtk::section::Type<14>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                .sequence_.
                super__Vector_base<njoy::ENDFtk::section::Type<14>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_158[0]._8_8_ = (lVar3 >> 4) * -0x71c71c71c71c71c7;
  local_168._1_1_ = lVar3 == 0x120;
  local_168._0_1_ = true;
  local_170 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62b8;
  local_168._4_4_ = 2;
  local_160 = "==";
  local_158[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_170);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xc4;
  macroName_20.m_size = 5;
  macroName_20.m_start = "CHECK";
  capturedExpression_20.m_size = 0x28;
  capturedExpression_20.m_start = "2 == chunk.angularDistributions().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_20,(SourceLineInfo *)local_170,
             capturedExpression_20,ContinueOnFailure);
  lVar3 = (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                .sequence_.
                super__Vector_base<njoy::ENDFtk::section::Type<14>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->
                super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
                super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                .sequence_.
                super__Vector_base<njoy::ENDFtk::section::Type<14>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_158[0]._8_8_ = (lVar3 >> 4) * -0x71c71c71c71c71c7;
  local_168._1_1_ = lVar3 == 0x120;
  local_168._0_1_ = true;
  local_170 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62b8;
  local_168._4_4_ = 2;
  local_160 = "==";
  local_158[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_170);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xc6;
  macroName_21.m_size = 10;
  macroName_21.m_start = "CHECK_THAT";
  capturedExpression_21.m_size = 0x2e;
  capturedExpression_21.m_start = "1e-5, WithinRel( chunk.incidentEnergies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_21,(SourceLineInfo *)local_170,
             capturedExpression_21,ContinueOnFailure);
  local_e8._vptr_ITransientExpression = (_func_int **)0x3ee4f8b588e368f1;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_170,
             (((chunk->
               super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
               super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
               .sequence_.
               super__Vector_base<njoy::ENDFtk::section::Type<14>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>_>
               ._M_impl.super__Vector_impl_data._M_start)->super_TabulationRecord).
             super_InterpolationBase.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_170,(double *)&local_e8);
  local_120._1_1_ = bVar2;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6238;
  local_118 = &local_e8;
  local_110[0]._0_8_ = (WithinRelMatcher *)local_170;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_170 = (undefined1  [8])0x198494;
  local_168 = (pointer)0xc7;
  macroName_22.m_size = 10;
  macroName_22.m_start = "CHECK_THAT";
  capturedExpression_22.m_size = 0x2e;
  capturedExpression_22.m_start = "2e+7, WithinRel( chunk.incidentEnergies()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_22,(SourceLineInfo *)local_170,
             capturedExpression_22,ContinueOnFailure);
  local_e8._vptr_ITransientExpression = (_func_int **)0x417312d000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_170,
             (chunk->
             super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
             super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
             .sequence_.
             super__Vector_base<njoy::ENDFtk::section::Type<14>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>_>
             ._M_impl.super__Vector_impl_data._M_start[1].super_TabulationRecord.
             super_InterpolationBase.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_170,(double *)&local_e8);
  local_120._1_1_ = bVar2;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6238;
  local_118 = &local_e8;
  local_110[0]._0_8_ = (WithinRelMatcher *)local_170;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_170);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  pTVar1 = (chunk->
           super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
           .sequence_.
           super__Vector_base<njoy::ENDFtk::section::Type<14>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c8._0_8_ = *(undefined8 *)&(pTVar1->super_TabulationRecord).super_InterpolationBase.metadata
  ;
  local_c8._8_8_ =
       (pTVar1->super_TabulationRecord).super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
  local_c8._16_8_ =
       (pTVar1->super_TabulationRecord).super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  local_c8._24_8_ =
       (pTVar1->super_TabulationRecord).super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  local_c8._32_8_ =
       (pTVar1->super_TabulationRecord).super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  local_c8._40_8_ =
       (pTVar1->super_TabulationRecord).super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_98,
             &(pTVar1->super_TabulationRecord).super_InterpolationBase.boundaryIndices);
  std::vector<long,_std::allocator<long>_>::vector
            (&local_80,
             &(pTVar1->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_68,&(pTVar1->super_TabulationRecord).xValues);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_50,&(pTVar1->super_TabulationRecord).yValues);
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xcc;
  macroName_23.m_size = 10;
  macroName_23.m_start = "CHECK_THAT";
  capturedExpression_23.m_size = 0x18;
  capturedExpression_23.m_start = "1e-5, WithinRel( d.E() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_23,(SourceLineInfo *)local_128,
             capturedExpression_23,ContinueOnFailure);
  local_f0 = 1e-05;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_128,(double)local_c8._32_8_);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_128,&local_f0);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d6238;
  local_d8 = &local_f0;
  local_d0 = (WithinRelMatcher *)local_128;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_170,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xcd;
  macroName_24.m_size = 10;
  macroName_24.m_start = "CHECK_THAT";
  capturedExpression_24.m_size = 0x25;
  capturedExpression_24.m_start = "1e-5, WithinRel( d.incidentEnergy() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_24,(SourceLineInfo *)local_128,
             capturedExpression_24,ContinueOnFailure);
  local_f0 = 1e-05;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_128,(double)local_c8._32_8_);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_128,&local_f0);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d6238;
  local_d8 = &local_f0;
  local_d0 = (WithinRelMatcher *)local_128;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_170,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xce;
  macroName_25.m_size = 5;
  macroName_25.m_start = "CHECK";
  capturedExpression_25.m_size = 0xb;
  capturedExpression_25.m_start = "2 == d.NP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_25,(SourceLineInfo *)local_128,
             capturedExpression_25,ContinueOnFailure);
  local_110[0]._8_8_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_120._1_1_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x10;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_120._4_4_ = 2;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xcf;
  macroName_26.m_size = 5;
  macroName_26.m_start = "CHECK";
  capturedExpression_26.m_size = 0x15;
  capturedExpression_26.m_start = "2 == d.numberPoints()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_26,(SourceLineInfo *)local_128,
             capturedExpression_26,ContinueOnFailure);
  local_110[0]._8_8_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_120._1_1_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x10;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_120._4_4_ = 2;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xd0;
  macroName_27.m_size = 5;
  macroName_27.m_start = "CHECK";
  capturedExpression_27.m_size = 0xb;
  capturedExpression_27.m_start = "1 == d.NR()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_27,(SourceLineInfo *)local_128,
             capturedExpression_27,ContinueOnFailure);
  lVar3 = CONCAT44(local_98._12_4_,local_98._8_4_) - local_98._0_8_;
  local_110[0]._8_8_ = lVar3 >> 3;
  local_120._1_1_ = lVar3 == 8;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_120._4_4_ = 1;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xd1;
  macroName_28.m_size = 5;
  macroName_28.m_start = "CHECK";
  capturedExpression_28.m_size = 0x23;
  capturedExpression_28.m_start = "1 == d.numberInterpolationRegions()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_28,(SourceLineInfo *)local_128,
             capturedExpression_28,ContinueOnFailure);
  lVar3 = CONCAT44(local_98._12_4_,local_98._8_4_) - local_98._0_8_;
  local_110[0]._8_8_ = lVar3 >> 3;
  local_120._1_1_ = lVar3 == 8;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_120._4_4_ = 1;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xd2;
  macroName_29.m_size = 5;
  macroName_29.m_start = "CHECK";
  capturedExpression_29.m_size = 0x13;
  capturedExpression_29.m_start = "1 == d.NBT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_29,(SourceLineInfo *)local_128,
             capturedExpression_29,ContinueOnFailure);
  lVar3 = CONCAT44(local_98._12_4_,local_98._8_4_) - local_98._0_8_;
  local_110[0]._8_8_ = lVar3 >> 3;
  local_120._1_1_ = lVar3 == 8;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62b8;
  local_120._4_4_ = 1;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xd3;
  macroName_30.m_size = 5;
  macroName_30.m_start = "CHECK";
  capturedExpression_30.m_size = 0x13;
  capturedExpression_30.m_start = "1 == d.INT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_30,(SourceLineInfo *)local_128,
             capturedExpression_30,ContinueOnFailure);
  local_110[0]._8_8_ =
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_120._1_1_ =
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start == 8;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62b8;
  local_120._4_4_ = 1;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xd4;
  macroName_31.m_size = 5;
  macroName_31.m_start = "CHECK";
  capturedExpression_31.m_size = 0xf;
  capturedExpression_31.m_start = "2 == d.NBT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_31,(SourceLineInfo *)local_128,
             capturedExpression_31,ContinueOnFailure);
  local_110[0]._8_8_ = *(undefined8 *)local_98._0_8_;
  local_120._1_1_ = local_110[0]._8_8_ == 2;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_120._4_4_ = 2;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xd5;
  macroName_32.m_size = 5;
  macroName_32.m_start = "CHECK";
  capturedExpression_32.m_size = 0xf;
  capturedExpression_32.m_start = "2 == d.INT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_32,(SourceLineInfo *)local_128,
             capturedExpression_32,ContinueOnFailure);
  local_110[0]._8_8_ =
       *local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start;
  local_120._1_1_ = local_110[0]._8_8_ == 2;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_120._4_4_ = 2;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xd6;
  macroName_33.m_size = 5;
  macroName_33.m_start = "CHECK";
  capturedExpression_33.m_size = 0x1a;
  capturedExpression_33.m_start = "1 == d.boundaries().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_33,(SourceLineInfo *)local_128,
             capturedExpression_33,ContinueOnFailure);
  lVar3 = CONCAT44(local_98._12_4_,local_98._8_4_) - local_98._0_8_;
  local_110[0]._8_8_ = lVar3 >> 3;
  local_120._1_1_ = lVar3 == 8;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62b8;
  local_120._4_4_ = 1;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xd7;
  macroName_34.m_size = 5;
  macroName_34.m_start = "CHECK";
  capturedExpression_34.m_size = 0x1c;
  capturedExpression_34.m_start = "1 == d.interpolants().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_34,(SourceLineInfo *)local_128,
             capturedExpression_34,ContinueOnFailure);
  local_110[0]._8_8_ =
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_120._1_1_ =
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start == 8;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62b8;
  local_120._4_4_ = 1;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xd8;
  macroName_35.m_size = 5;
  macroName_35.m_start = "CHECK";
  capturedExpression_35.m_size = 0x16;
  capturedExpression_35.m_start = "2 == d.boundaries()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_35,(SourceLineInfo *)local_128,
             capturedExpression_35,ContinueOnFailure);
  local_110[0]._8_8_ = *(undefined8 *)local_98._0_8_;
  local_120._1_1_ = local_110[0]._8_8_ == 2;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_120._4_4_ = 2;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xd9;
  macroName_36.m_size = 5;
  macroName_36.m_start = "CHECK";
  capturedExpression_36.m_size = 0x18;
  capturedExpression_36.m_start = "2 == d.interpolants()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_36,(SourceLineInfo *)local_128,
             capturedExpression_36,ContinueOnFailure);
  local_110[0]._8_8_ =
       *local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start;
  local_120._1_1_ = local_110[0]._8_8_ == 2;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_120._4_4_ = 2;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xda;
  macroName_37.m_size = 5;
  macroName_37.m_start = "CHECK";
  capturedExpression_37.m_size = 0x17;
  capturedExpression_37.m_start = "2 == d.cosines().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_37,(SourceLineInfo *)local_128,
             capturedExpression_37,ContinueOnFailure);
  local_110[0]._8_8_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_120._1_1_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x10;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62b8;
  local_120._4_4_ = 2;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xdb;
  macroName_38.m_size = 10;
  macroName_38.m_start = "CHECK_THAT";
  capturedExpression_38.m_size = 0x21;
  capturedExpression_38.m_start = "-1.0, WithinRel( d.cosines()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_38,(SourceLineInfo *)local_128,
             capturedExpression_38,ContinueOnFailure);
  local_f0 = -1.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_128,
             *local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_128,&local_f0);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d6238;
  local_d8 = &local_f0;
  local_d0 = (WithinRelMatcher *)local_128;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_170,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xdc;
  macroName_39.m_size = 10;
  macroName_39.m_start = "CHECK_THAT";
  capturedExpression_39.m_size = 0x20;
  capturedExpression_39.m_start = "1.0, WithinRel( d.cosines()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_39,(SourceLineInfo *)local_128,
             capturedExpression_39,ContinueOnFailure);
  local_f0 = 1.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_128,
             local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_128,&local_f0);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d6238;
  local_d8 = &local_f0;
  local_d0 = (WithinRelMatcher *)local_128;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_170,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xdd;
  macroName_40.m_size = 5;
  macroName_40.m_start = "CHECK";
  capturedExpression_40.m_size = 0x1d;
  capturedExpression_40.m_start = "2 == d.probabilities().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_40,(SourceLineInfo *)local_128,
             capturedExpression_40,ContinueOnFailure);
  local_110[0]._8_8_ =
       (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_120._1_1_ =
       (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x10;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62b8;
  local_120._4_4_ = 2;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xde;
  macroName_41.m_size = 10;
  macroName_41.m_start = "CHECK_THAT";
  capturedExpression_41.m_size = 0x26;
  capturedExpression_41.m_start = "0.5, WithinRel( d.probabilities()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_41,(SourceLineInfo *)local_128,
             capturedExpression_41,ContinueOnFailure);
  local_f0 = 0.5;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_128,
             *local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_128,&local_f0);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d6238;
  local_d8 = &local_f0;
  local_d0 = (WithinRelMatcher *)local_128;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_170,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xdf;
  macroName_42.m_size = 10;
  macroName_42.m_start = "CHECK_THAT";
  capturedExpression_42.m_size = 0x26;
  capturedExpression_42.m_start = "0.5, WithinRel( d.probabilities()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_42,(SourceLineInfo *)local_128,
             capturedExpression_42,ContinueOnFailure);
  local_f0 = 0.5;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_128,
             local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_128,&local_f0);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d6238;
  local_d8 = &local_f0;
  local_d0 = (WithinRelMatcher *)local_128;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_170,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  pTVar1 = (chunk->
           super_AngularDistributions<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>).
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
           .sequence_.
           super__Vector_base<njoy::ENDFtk::section::Type<14>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c8._32_8_ =
       pTVar1[1].super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  local_c8._40_8_ =
       pTVar1[1].super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  local_c8._16_8_ =
       pTVar1[1].super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  local_c8._24_8_ =
       pTVar1[1].super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  local_c8._0_8_ = *(undefined8 *)&pTVar1[1].super_TabulationRecord.super_InterpolationBase.metadata
  ;
  local_c8._8_8_ =
       pTVar1[1].super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
  std::vector<long,_std::allocator<long>_>::operator=
            ((vector<long,_std::allocator<long>_> *)local_98,
             &pTVar1[1].super_TabulationRecord.super_InterpolationBase.boundaryIndices);
  std::vector<long,_std::allocator<long>_>::operator=
            (&local_80,
             &pTVar1[1].super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices);
  std::vector<double,_std::allocator<double>_>::operator=
            (&local_68,&pTVar1[1].super_TabulationRecord.xValues);
  std::vector<double,_std::allocator<double>_>::operator=
            (&local_50,&pTVar1[1].super_TabulationRecord.yValues);
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xe2;
  macroName_43.m_size = 10;
  macroName_43.m_start = "CHECK_THAT";
  capturedExpression_43.m_size = 0x18;
  capturedExpression_43.m_start = "2e+7, WithinRel( d.E() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_43,(SourceLineInfo *)local_128,
             capturedExpression_43,ContinueOnFailure);
  local_f0 = 20000000.0;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_128,(double)local_c8._32_8_);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_128,&local_f0);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d6238;
  local_d8 = &local_f0;
  local_d0 = (WithinRelMatcher *)local_128;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_170,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xe3;
  macroName_44.m_size = 10;
  macroName_44.m_start = "CHECK_THAT";
  capturedExpression_44.m_size = 0x25;
  capturedExpression_44.m_start = "2e+7, WithinRel( d.incidentEnergy() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_44,(SourceLineInfo *)local_128,
             capturedExpression_44,ContinueOnFailure);
  local_f0 = 20000000.0;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_128,(double)local_c8._32_8_);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_128,&local_f0);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d6238;
  local_d8 = &local_f0;
  local_d0 = (WithinRelMatcher *)local_128;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_170,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xe4;
  macroName_45.m_size = 5;
  macroName_45.m_start = "CHECK";
  capturedExpression_45.m_size = 0xb;
  capturedExpression_45.m_start = "3 == d.NP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_45,(SourceLineInfo *)local_128,
             capturedExpression_45,ContinueOnFailure);
  local_110[0]._8_8_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_120._1_1_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x18;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_120._4_4_ = 3;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xe5;
  macroName_46.m_size = 5;
  macroName_46.m_start = "CHECK";
  capturedExpression_46.m_size = 0x15;
  capturedExpression_46.m_start = "3 == d.numberPoints()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_46,(SourceLineInfo *)local_128,
             capturedExpression_46,ContinueOnFailure);
  local_110[0]._8_8_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_120._1_1_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x18;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_120._4_4_ = 3;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xe6;
  macroName_47.m_size = 5;
  macroName_47.m_start = "CHECK";
  capturedExpression_47.m_size = 0xb;
  capturedExpression_47.m_start = "1 == d.NR()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_47,(SourceLineInfo *)local_128,
             capturedExpression_47,ContinueOnFailure);
  lVar3 = CONCAT44(local_98._12_4_,local_98._8_4_) - local_98._0_8_;
  local_110[0]._8_8_ = lVar3 >> 3;
  local_120._1_1_ = lVar3 == 8;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_120._4_4_ = 1;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xe7;
  macroName_48.m_size = 5;
  macroName_48.m_start = "CHECK";
  capturedExpression_48.m_size = 0x23;
  capturedExpression_48.m_start = "1 == d.numberInterpolationRegions()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_48,(SourceLineInfo *)local_128,
             capturedExpression_48,ContinueOnFailure);
  lVar3 = CONCAT44(local_98._12_4_,local_98._8_4_) - local_98._0_8_;
  local_110[0]._8_8_ = lVar3 >> 3;
  local_120._1_1_ = lVar3 == 8;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_120._4_4_ = 1;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xe8;
  macroName_49.m_size = 5;
  macroName_49.m_start = "CHECK";
  capturedExpression_49.m_size = 0x13;
  capturedExpression_49.m_start = "1 == d.NBT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_49,(SourceLineInfo *)local_128,
             capturedExpression_49,ContinueOnFailure);
  lVar3 = CONCAT44(local_98._12_4_,local_98._8_4_) - local_98._0_8_;
  local_110[0]._8_8_ = lVar3 >> 3;
  local_120._1_1_ = lVar3 == 8;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62b8;
  local_120._4_4_ = 1;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xe9;
  macroName_50.m_size = 5;
  macroName_50.m_start = "CHECK";
  capturedExpression_50.m_size = 0x13;
  capturedExpression_50.m_start = "1 == d.INT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_50,(SourceLineInfo *)local_128,
             capturedExpression_50,ContinueOnFailure);
  local_110[0]._8_8_ =
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_120._1_1_ =
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start == 8;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62b8;
  local_120._4_4_ = 1;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xea;
  macroName_51.m_size = 5;
  macroName_51.m_start = "CHECK";
  capturedExpression_51.m_size = 0xf;
  capturedExpression_51.m_start = "3 == d.NBT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_51,(SourceLineInfo *)local_128,
             capturedExpression_51,ContinueOnFailure);
  local_110[0]._8_8_ = *(undefined8 *)local_98._0_8_;
  local_120._1_1_ = local_110[0]._8_8_ == 3;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_120._4_4_ = 3;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xeb;
  macroName_52.m_size = 5;
  macroName_52.m_start = "CHECK";
  capturedExpression_52.m_size = 0xf;
  capturedExpression_52.m_start = "2 == d.INT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_52,(SourceLineInfo *)local_128,
             capturedExpression_52,ContinueOnFailure);
  local_110[0]._8_8_ =
       *local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start;
  local_120._1_1_ = local_110[0]._8_8_ == 2;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_120._4_4_ = 2;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xec;
  macroName_53.m_size = 5;
  macroName_53.m_start = "CHECK";
  capturedExpression_53.m_size = 0x1a;
  capturedExpression_53.m_start = "1 == d.boundaries().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_53,(SourceLineInfo *)local_128,
             capturedExpression_53,ContinueOnFailure);
  lVar3 = CONCAT44(local_98._12_4_,local_98._8_4_) - local_98._0_8_;
  local_110[0]._8_8_ = lVar3 >> 3;
  local_120._1_1_ = lVar3 == 8;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62b8;
  local_120._4_4_ = 1;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xed;
  macroName_54.m_size = 5;
  macroName_54.m_start = "CHECK";
  capturedExpression_54.m_size = 0x1c;
  capturedExpression_54.m_start = "1 == d.interpolants().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_54,(SourceLineInfo *)local_128,
             capturedExpression_54,ContinueOnFailure);
  local_110[0]._8_8_ =
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_120._1_1_ =
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start == 8;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62b8;
  local_120._4_4_ = 1;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xee;
  macroName_55.m_size = 5;
  macroName_55.m_start = "CHECK";
  capturedExpression_55.m_size = 0x16;
  capturedExpression_55.m_start = "3 == d.boundaries()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_55,(SourceLineInfo *)local_128,
             capturedExpression_55,ContinueOnFailure);
  local_110[0]._8_8_ = *(undefined8 *)local_98._0_8_;
  local_120._1_1_ = local_110[0]._8_8_ == 3;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_120._4_4_ = 3;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xef;
  macroName_56.m_size = 5;
  macroName_56.m_start = "CHECK";
  capturedExpression_56.m_size = 0x18;
  capturedExpression_56.m_start = "2 == d.interpolants()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_56,(SourceLineInfo *)local_128,
             capturedExpression_56,ContinueOnFailure);
  local_110[0]._8_8_ =
       *local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start;
  local_120._1_1_ = local_110[0]._8_8_ == 2;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_120._4_4_ = 2;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xf0;
  macroName_57.m_size = 5;
  macroName_57.m_start = "CHECK";
  capturedExpression_57.m_size = 0x17;
  capturedExpression_57.m_start = "3 == d.cosines().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_57,(SourceLineInfo *)local_128,
             capturedExpression_57,ContinueOnFailure);
  local_110[0]._8_8_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_120._1_1_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x18;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62b8;
  local_120._4_4_ = 3;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xf1;
  macroName_58.m_size = 10;
  macroName_58.m_start = "CHECK_THAT";
  capturedExpression_58.m_size = 0x21;
  capturedExpression_58.m_start = "-1.0, WithinRel( d.cosines()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_58,(SourceLineInfo *)local_128,
             capturedExpression_58,ContinueOnFailure);
  local_f0 = -1.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_128,
             *local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_128,&local_f0);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d6238;
  local_d8 = &local_f0;
  local_d0 = (WithinRelMatcher *)local_128;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_170,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xf2;
  macroName_59.m_size = 10;
  macroName_59.m_start = "CHECK_THAT";
  capturedExpression_59.m_size = 0x20;
  capturedExpression_59.m_start = "0.0, WithinRel( d.cosines()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_59,(SourceLineInfo *)local_128,
             capturedExpression_59,ContinueOnFailure);
  local_f0 = 0.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_128,
             local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_128,&local_f0);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d6238;
  local_d8 = &local_f0;
  local_d0 = (WithinRelMatcher *)local_128;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_170,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xf3;
  macroName_60.m_size = 10;
  macroName_60.m_start = "CHECK_THAT";
  capturedExpression_60.m_size = 0x20;
  capturedExpression_60.m_start = "1.0, WithinRel( d.cosines()[2] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_60,(SourceLineInfo *)local_128,
             capturedExpression_60,ContinueOnFailure);
  local_f0 = 1.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_128,
             local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2]);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_128,&local_f0);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d6238;
  local_d8 = &local_f0;
  local_d0 = (WithinRelMatcher *)local_128;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_170,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xf4;
  macroName_61.m_size = 5;
  macroName_61.m_start = "CHECK";
  capturedExpression_61.m_size = 0x1d;
  capturedExpression_61.m_start = "3 == d.probabilities().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_61,(SourceLineInfo *)local_128,
             capturedExpression_61,ContinueOnFailure);
  local_110[0]._8_8_ =
       (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_120._1_1_ =
       (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x18;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62b8;
  local_120._4_4_ = 3;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xf5;
  macroName_62.m_size = 10;
  macroName_62.m_start = "CHECK_THAT";
  capturedExpression_62.m_size = 0x26;
  capturedExpression_62.m_start = "0.0, WithinRel( d.probabilities()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_62,(SourceLineInfo *)local_128,
             capturedExpression_62,ContinueOnFailure);
  local_f0 = 0.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_128,
             *local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_128,&local_f0);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d6238;
  local_d8 = &local_f0;
  local_d0 = (WithinRelMatcher *)local_128;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_170,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xf6;
  macroName_63.m_size = 10;
  macroName_63.m_start = "CHECK_THAT";
  capturedExpression_63.m_size = 0x26;
  capturedExpression_63.m_start = "1.0, WithinRel( d.probabilities()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_63,(SourceLineInfo *)local_128,
             capturedExpression_63,ContinueOnFailure);
  local_f0 = 1.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_128,
             local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_128,&local_f0);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d6238;
  local_d8 = &local_f0;
  local_d0 = (WithinRelMatcher *)local_128;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_170,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xf7;
  macroName_64.m_size = 10;
  macroName_64.m_start = "CHECK_THAT";
  capturedExpression_64.m_size = 0x26;
  capturedExpression_64.m_start = "0.0, WithinRel( d.probabilities()[2] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_64,(SourceLineInfo *)local_128,
             capturedExpression_64,ContinueOnFailure);
  local_f0 = 0.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_128,
             local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2]);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_128,&local_f0);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d6238;
  local_d8 = &local_f0;
  local_d0 = (WithinRelMatcher *)local_128;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_170,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  local_128 = (undefined1  [8])0x198494;
  local_120 = (pointer)0xf9;
  macroName_65.m_size = 5;
  macroName_65.m_start = "CHECK";
  capturedExpression_65.m_size = 0xf;
  capturedExpression_65.m_start = "8 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_170,macroName_65,(SourceLineInfo *)local_128,
             capturedExpression_65,ContinueOnFailure);
  local_110[0]._8_8_ =
       njoy::ENDFtk::
       InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>::NC
                 ((InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::TabulatedDistribution>
                   *)chunk);
  local_120._1_1_ = local_110[0]._8_8_ == 8;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6278;
  local_120._4_4_ = 8;
  local_118 = (ITransientExpression *)0x199bf8;
  local_110[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_170,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_170);
  if (local_135 == false) {
    (*local_130->_vptr_IResultCapture[0x13])();
  }
  if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (long *)0x0) {
    operator_delete(local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((long *)local_98._0_8_ != (long *)0x0) {
    operator_delete((void *)local_98._0_8_,(long)local_88 - local_98._0_8_);
  }
  return;
}

Assistant:

void verifyChunk( const TabulatedDistributions& chunk ) {

  CHECK( false == chunk.LI() );
  CHECK( false == chunk.isotropicDistributions() );
  CHECK( 2 == chunk.LTT() );
  CHECK( 2 == chunk.LAW() );

  CHECK_THAT( 1., WithinRel( chunk.EG() ) );
  CHECK_THAT( 1., WithinRel( chunk.photonEnergy() ) );
  CHECK_THAT( 2., WithinRel( chunk.ES() ) );
  CHECK_THAT( 2., WithinRel( chunk.levelEnergy() ) );

  CHECK( 2 == chunk.NE() );
  CHECK( 2 == chunk.numberIncidentEnergies() );
  CHECK( 1 == chunk.NR() );
  CHECK( 1 == chunk.numberInterpolationRegions() );
  CHECK( 1 == chunk.INT().size() );
  CHECK( 1 == chunk.NBT().size() );
  CHECK( 1 == chunk.INT()[0] );
  CHECK( 2 == chunk.NBT()[0] );
  CHECK( 1 == chunk.interpolants().size() );
  CHECK( 1 == chunk.boundaries().size() );
  CHECK( 1 == chunk.interpolants()[0] );
  CHECK( 2 == chunk.boundaries()[0] );

  CHECK( 2 == chunk.incidentEnergies().size() );
  CHECK( 2 == chunk.angularDistributions().size() );

  CHECK_THAT( 1e-5, WithinRel( chunk.incidentEnergies()[0] ) );
  CHECK_THAT( 2e+7, WithinRel( chunk.incidentEnergies()[1] ) );

  auto distributions = chunk.angularDistributions();

  auto d = distributions[0];
  CHECK_THAT( 1e-5, WithinRel( d.E() ) );
  CHECK_THAT( 1e-5, WithinRel( d.incidentEnergy() ) );
  CHECK( 2 == d.NP() );
  CHECK( 2 == d.numberPoints() );
  CHECK( 1 == d.NR() );
  CHECK( 1 == d.numberInterpolationRegions() );
  CHECK( 1 == d.NBT().size() );
  CHECK( 1 == d.INT().size() );
  CHECK( 2 == d.NBT()[0] );
  CHECK( 2 == d.INT()[0] );
  CHECK( 1 == d.boundaries().size() );
  CHECK( 1 == d.interpolants().size() );
  CHECK( 2 == d.boundaries()[0] );
  CHECK( 2 == d.interpolants()[0] );
  CHECK( 2 == d.cosines().size() );
  CHECK_THAT( -1.0 , WithinRel( d.cosines()[0] ) );
  CHECK_THAT( 1.0, WithinRel( d.cosines()[1] ) );
  CHECK( 2 == d.probabilities().size() );
  CHECK_THAT( 0.5 , WithinRel( d.probabilities()[0] ) );
  CHECK_THAT( 0.5, WithinRel( d.probabilities()[1] ) );

  d = distributions[1];
  CHECK_THAT( 2e+7, WithinRel( d.E() ) );
  CHECK_THAT( 2e+7, WithinRel( d.incidentEnergy() ) );
  CHECK( 3 == d.NP() );
  CHECK( 3 == d.numberPoints() );
  CHECK( 1 == d.NR() );
  CHECK( 1 == d.numberInterpolationRegions() );
  CHECK( 1 == d.NBT().size() );
  CHECK( 1 == d.INT().size() );
  CHECK( 3 == d.NBT()[0] );
  CHECK( 2 == d.INT()[0] );
  CHECK( 1 == d.boundaries().size() );
  CHECK( 1 == d.interpolants().size() );
  CHECK( 3 == d.boundaries()[0] );
  CHECK( 2 == d.interpolants()[0] );
  CHECK( 3 == d.cosines().size() );
  CHECK_THAT( -1.0 , WithinRel( d.cosines()[0] ) );
  CHECK_THAT( 0.0, WithinRel( d.cosines()[1] ) );
  CHECK_THAT( 1.0, WithinRel( d.cosines()[2] ) );
  CHECK( 3 == d.probabilities().size() );
  CHECK_THAT( 0.0 , WithinRel( d.probabilities()[0] ) );
  CHECK_THAT( 1.0, WithinRel( d.probabilities()[1] ) );
  CHECK_THAT( 0.0, WithinRel( d.probabilities()[2] ) );

  CHECK( 8 == chunk.NC() );
}